

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  pointer *pppcVar1;
  cmake *pcVar2;
  iterator __position;
  undefined *puVar3;
  bool bVar4;
  char *pcVar5;
  cmMakefile *pcVar6;
  pointer ppcVar7;
  ostream *poVar8;
  ulong uVar9;
  __hashtable *__h;
  undefined **ppuVar10;
  pointer gti;
  cmMakefile *dirMf;
  string f;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  cmStateSnapshot snapshot;
  ostringstream msg;
  char num [100];
  allocator local_549;
  cmMakefile *local_548;
  long *local_540;
  long local_538;
  long local_530 [2];
  ulong local_520;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  local_518;
  cmStateSnapshot local_4f8;
  undefined1 local_4d8 [32];
  undefined1 local_4b8 [576];
  undefined1 local_278 [584];
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  pcVar2 = this->CMakeInstance;
  local_4f8.Position.Position = (pcVar2->CurrentSnapshot).Position.Position;
  local_4f8.State = (pcVar2->CurrentSnapshot).State;
  local_4f8.Position.Tree = (pcVar2->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_4d8,&local_4f8);
  pcVar5 = cmake::GetHomeDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_278,pcVar5,(allocator *)&local_540);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_4d8,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_4d8,&local_4f8);
  pcVar5 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_278,pcVar5,(allocator *)&local_540);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_4d8,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  pcVar6 = (cmMakefile *)operator_new(0x760);
  cmMakefile::cmMakefile(pcVar6,this,&local_4f8);
  __position._M_current =
       (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_548 = pcVar6;
  if (__position._M_current ==
      (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
              ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->Makefiles,__position,
               &local_548);
  }
  else {
    *__position._M_current = pcVar6;
    pppcVar1 = &(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  IndexMakefile(this,local_548);
  pcVar5 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_4d8,pcVar5,(allocator *)local_278);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_4d8._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_4d8 + 0x10)) {
    operator_delete((void *)local_4d8._0_8_,(ulong)(local_4d8._16_8_ + 1));
  }
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(local_548);
  cmMakefile::EnforceDirectoryLevelRules(local_548);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  local_518.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (GlobalTargetInfo *)0x0;
  local_518.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (GlobalTargetInfo *)0x0;
  local_518.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CreateDefaultGlobalTargets(this,&local_518);
  ppcVar7 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppcVar7) {
    uVar9 = 0;
  }
  else {
    local_520 = 0;
    do {
      if (local_518.
          super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_518.
          super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar6 = ppcVar7[local_520];
        gti = local_518.
              super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          CreateGlobalTarget((cmTarget *)local_278,this,gti,pcVar6);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
                      *)local_4d8,&gti->Name,(cmTarget *)local_278);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,cmTarget>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&pcVar6->Targets,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
                      *)local_4d8);
          cmTarget::~cmTarget((cmTarget *)local_4b8);
          if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_4d8._0_8_ !=
              (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_4d8 + 0x10)) {
            operator_delete((void *)local_4d8._0_8_,(ulong)(local_4d8._16_8_ + 1));
          }
          cmTarget::~cmTarget((cmTarget *)local_278);
          gti = gti + 1;
        } while (gti != local_518.
                        super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_520 = (ulong)((int)local_520 + 1);
      ppcVar7 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar9 = (long)(this->Makefiles).
                    super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppcVar7 >> 3;
    } while (local_520 < uVar9);
  }
  sprintf(local_278,"%d",uVar9);
  pcVar2 = this->CMakeInstance;
  local_4d8._0_8_ = local_4d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4d8,"CMAKE_NUMBER_OF_MAKEFILES","");
  cmake::AddCacheEntry(pcVar2,(string *)local_4d8,local_278,"number of local generators",4);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_4d8._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_4d8 + 0x10)) {
    operator_delete((void *)local_4d8._0_8_,(ulong)(local_4d8._16_8_ + 1));
  }
  CheckTargetProperties(this);
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
    if (((cmSystemTools::s_ErrorOccured != false) || (cmSystemTools::s_FatalErrorOccured != false))
       || (bVar4 = cmSystemTools::GetInterruptFlag(), bVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4d8,"Configuring incomplete, errors occurred!",0x28);
      ppuVar10 = &PTR_anon_var_dwarf_2d1c04_00692258;
      do {
        pcVar5 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
        std::__cxx11::string::string((string *)&local_540,pcVar5,&local_549);
        std::__cxx11::string::append((char *)&local_540);
        std::__cxx11::string::append((char *)&local_540);
        std::__cxx11::string::append((char *)&local_540);
        bVar4 = cmsys::SystemTools::FileExists((char *)local_540);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d8,"\nSee also \"",0xb);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4d8,(char *)local_540,local_538);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
        }
        if (local_540 != local_530) {
          operator_delete(local_540,local_530[0] + 1);
        }
        puVar3 = *ppuVar10;
        ppuVar10 = ppuVar10 + 1;
      } while (puVar3 != (undefined *)0x0);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4d8,"Configuring done",0x10);
    }
    pcVar2 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar2,(char *)local_540,-1.0);
    if (local_540 != local_530) {
      operator_delete(local_540,local_530[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
    std::ios_base::~ios_base((ios_base *)(local_4b8 + 0x50));
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector(&local_518);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  cmMakefile* dirMf = new cmMakefile(this, snapshot);
  this->Makefiles.push_back(dirMf);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  std::vector<GlobalTargetInfo> globalTargets;
  this->CreateDefaultGlobalTargets(globalTargets);

  for (unsigned int i = 0; i < this->Makefiles.size(); ++i) {
    cmMakefile* mf = this->Makefiles[i];
    cmTargets* targets = &(mf->GetTargets());
    for (std::vector<GlobalTargetInfo>::iterator gti = globalTargets.begin();
         gti != globalTargets.end(); ++gti) {
      targets->insert(
        cmTargets::value_type(gti->Name, this->CreateGlobalTarget(*gti, mf)));
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num, "%d", static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry("CMAKE_NUMBER_OF_MAKEFILES", num,
                                          "number of local generators",
                                          cmStateEnums::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckTargetProperties();

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccuredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = { "CMakeOutput.log", "CMakeError.log", CM_NULLPTR };
      for (const char** log = logs; *log; ++log) {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += this->CMakeInstance->GetCMakeFilesDirectory();
        f += "/";
        f += *log;
        if (cmSystemTools::FileExists(f.c_str())) {
          msg << "\nSee also \"" << f << "\".";
        }
      }
    } else {
      msg << "Configuring done";
    }
    this->CMakeInstance->UpdateProgress(msg.str().c_str(), -1);
  }
}